

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O3

uv_os_sock_t create_bound_socket(sockaddr_in bind_addr)

{
  long *plVar1;
  __pthread_list_t *handle;
  uv_handle_t *handle_00;
  uv_loop_t *handle_01;
  uint uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  uint uVar5;
  uv_os_sock_t extraout_EAX_00;
  uv_os_sock_t extraout_EAX_01;
  uv_os_sock_t extraout_EAX_02;
  uv_os_sock_t extraout_EAX_03;
  connection_context_t *handle_02;
  uv_poll_t *handle_03;
  ssize_t sVar6;
  ulong uVar7;
  int *piVar8;
  long extraout_RAX;
  long lVar9;
  uint extraout_EDX;
  size_t sVar10;
  ulong unaff_RBX;
  uv_handle_type uVar11;
  uv_handle_type uVar12;
  sockaddr *__addr;
  uv_poll_t *puVar13;
  undefined8 *puVar14;
  uv_loop_t *puVar15;
  uv_loop_t *puVar16;
  uv_loop_t *puVar17;
  int yes;
  socklen_t sStack_44;
  sockaddr sStack_40;
  code *pcStack_30;
  undefined4 local_1c;
  sockaddr local_18;
  
  puVar14 = (undefined8 *)0x2;
  pcStack_30 = (code *)0x165052;
  uVar2 = socket(2,1,0);
  if ((int)uVar2 < 0) {
    pcStack_30 = (code *)0x1650a0;
    create_bound_socket_cold_1();
LAB_001650a0:
    pcStack_30 = (code *)0x1650a5;
    create_bound_socket_cold_2();
  }
  else {
    unaff_RBX = (ulong)uVar2;
    local_1c = 1;
    puVar14 = (undefined8 *)(ulong)uVar2;
    pcStack_30 = (code *)0x16507a;
    iVar3 = setsockopt(uVar2,1,2,&local_1c,4);
    if (iVar3 != 0) goto LAB_001650a0;
    puVar14 = (undefined8 *)(ulong)uVar2;
    pcStack_30 = (code *)0x16508f;
    iVar3 = bind(uVar2,&local_18,0x10);
    if (iVar3 == 0) {
      return uVar2;
    }
  }
  pcStack_30 = server_poll_cb;
  create_bound_socket_cold_3();
  handle_00 = (uv_handle_t *)*puVar14;
  sStack_44 = 0x10;
  iVar3 = *(int *)((long)&handle_00[1].u + 0x10);
  __addr = &sStack_40;
  pcStack_30 = (code *)unaff_RBX;
  iVar4 = accept(iVar3,__addr,&sStack_44);
  uVar11 = (uv_handle_type)__addr;
  if (iVar4 < 0) {
    server_poll_cb_cold_1();
  }
  else {
    handle_02 = create_connection_context(iVar4,1);
    handle_02->events = 7;
    uVar11 = UV_NAMED_PIPE;
    iVar4 = uv_poll_start(&handle_02->poll_handle,7,connection_poll_cb);
    iVar3 = (int)handle_02;
    if (iVar4 == 0) {
      iVar3 = *(int *)((long)&handle_00[1].u + 0x14) + 1;
      *(int *)((long)&handle_00[1].u + 0x14) = iVar3;
      if (iVar3 == 5) {
        close_socket(*(uv_os_sock_t *)((long)&handle_00[1].u + 0x10));
        uv_close(handle_00,server_close_cb);
        iVar3 = extraout_EAX;
      }
      return iVar3;
    }
  }
  server_poll_cb_cold_2();
  puVar15 = (uv_loop_t *)0x170;
  uVar12 = uVar11;
  handle_03 = (uv_poll_t *)malloc(0x170);
  if (handle_03 == (uv_poll_t *)0x0) {
    create_connection_context_cold_3();
LAB_001651d4:
    create_connection_context_cold_1();
  }
  else {
    handle_03[1].io_watcher.fd = iVar3;
    handle_03[2].type = uVar11;
    handle_03[2].data = (void *)0x0;
    handle_03[2].loop = (uv_loop_t *)0x0;
    *(undefined8 *)&handle_03[2].field_0x14 = 0;
    *(undefined8 *)((long)&handle_03[2].close_cb + 4) = 0;
    *(undefined8 *)((long)handle_03[2].handle_queue + 4) = 0;
    puVar15 = uv_default_loop();
    puVar13 = handle_03;
    iVar3 = uv_poll_init_socket(puVar15,handle_03,iVar3);
    uVar12 = (uv_handle_type)puVar13;
    *(int *)&handle_03[2].field_0x14 = *(int *)&handle_03[2].field_0x14 + 1;
    handle_03->data = handle_03;
    if (iVar3 != 0) goto LAB_001651d4;
    puVar15 = uv_default_loop();
    puVar13 = handle_03 + 1;
    iVar3 = uv_timer_init(puVar15,(uv_timer_t *)puVar13);
    uVar12 = (uv_handle_type)puVar13;
    *(int *)&handle_03[2].field_0x14 = *(int *)&handle_03[2].field_0x14 + 1;
    handle_03[1].data = handle_03;
    if (iVar3 == 0) {
      return (uv_os_sock_t)handle_03;
    }
  }
  create_connection_context_cold_2();
  puVar16 = puVar15;
  if (uVar12 == UV_UNKNOWN_HANDLE) {
    handle_01 = (uv_loop_t *)puVar15->data;
    uVar2 = *(uint *)((long)&handle_01->cloexec_lock + 0x34);
    if ((uVar2 & extraout_EDX) == 0) goto LAB_001656f4;
    if ((~uVar2 & extraout_EDX) != 0) goto LAB_001656f9;
    if ((extraout_EDX & 1) == 0) goto switchD_00165261_caseD_4;
    iVar3 = rand();
    switch(iVar3 % 7) {
    case 0:
    case 1:
      uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
      puVar16 = (uv_loop_t *)(ulong)uVar5;
      sVar6 = recv(uVar5,connection_poll_cb::buffer,0x4a,0);
      uVar5 = (uint)sVar6;
      if (-1 < (int)uVar5) {
        if (uVar5 == 0) goto LAB_00165306;
        plVar1 = (long *)((long)&handle_01->cloexec_lock + 0x10);
        *plVar1 = *plVar1 + (ulong)(uVar5 & 0x7fffffff);
        break;
      }
      goto LAB_00165708;
    case 2:
    case 3:
      uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
      puVar16 = (uv_loop_t *)(ulong)uVar5;
      uVar7 = recv(uVar5,connection_poll_cb::buffer_1,0x3a3,0);
      if (-1 < (int)uVar7) {
        if ((int)uVar7 != 0) {
          do {
            plVar1 = (long *)((long)&handle_01->cloexec_lock + 0x10);
            *plVar1 = *plVar1 + (uVar7 & 0xffffffff);
            uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
            puVar16 = (uv_loop_t *)(ulong)uVar5;
            uVar7 = recv(uVar5,connection_poll_cb::buffer_1,0x3a3,0);
          } while (0 < (int)uVar7);
          if ((int)uVar7 != 0) {
            piVar8 = __errno_location();
            if ((*piVar8 == 0xb) || (*piVar8 == 0x73)) break;
            connection_poll_cb_cold_4();
          }
        }
LAB_00165306:
        *(undefined4 *)((long)&handle_01->cloexec_lock + 0x28) = 1;
        uVar2 = uVar2 & 0xfffffffe;
        break;
      }
      goto LAB_0016570d;
    case 4:
      break;
    case 5:
      uVar2 = uVar2 & 0xfffffffe;
      puVar16 = (uv_loop_t *)&(handle_01->wq_mutex).__data.__list;
      puVar17 = puVar16;
      iVar3 = uv_is_active((uv_handle_t *)puVar16);
      if (iVar3 == 0) {
        *(undefined4 *)&handle_01->closing_handles = 1;
        uv_timer_start((uv_timer_t *)puVar16,delay_timer_cb,10,0);
      }
      else {
        *(byte *)&handle_01->closing_handles = *(byte *)&handle_01->closing_handles | 1;
        puVar16 = puVar17;
      }
      break;
    case 6:
      uv_poll_start((uv_poll_t *)handle_01,2,connection_poll_cb);
      puVar16 = handle_01;
      uv_poll_start((uv_poll_t *)handle_01,1,connection_poll_cb);
      *(undefined4 *)((long)&handle_01->cloexec_lock + 0x34) = 1;
      break;
    default:
      goto switchD_00165261_default;
    }
switchD_00165261_caseD_4:
    if ((extraout_EDX & 2) == 0) goto switchD_001654f0_caseD_4;
    if ((*(ulong *)((long)&handle_01->cloexec_lock + 0x18) < 0x10000) &&
       ((test_mode != '\x01' || (*(int *)((long)&handle_01->cloexec_lock + 0x20) == 0)))) {
      iVar3 = rand();
      switch(iVar3 % 7) {
      case 0:
      case 1:
        lVar9 = *(long *)((long)&handle_01->cloexec_lock + 0x18);
        if (lVar9 == 0x10000) goto LAB_00165717;
        uVar7 = 0x10000 - lVar9;
        sVar10 = 0x67;
        if (uVar7 < 0x67) {
          sVar10 = uVar7;
        }
        uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
        puVar16 = (uv_loop_t *)(ulong)uVar5;
        sVar6 = send(uVar5,connection_poll_cb::buffer_2,sVar10,0);
        uVar5 = (uint)sVar6;
        if ((int)uVar5 < 0) {
          piVar8 = __errno_location();
          if ((*piVar8 != 0xb) && (*piVar8 != 0x73)) {
            connection_poll_cb_cold_13();
            goto LAB_0016568b;
          }
LAB_001656a0:
          spurious_writable_wakeups = spurious_writable_wakeups + 1;
          break;
        }
        if (uVar5 != 0) {
          plVar1 = (long *)((long)&handle_01->cloexec_lock + 0x18);
          *plVar1 = *plVar1 + (ulong)(uVar5 & 0x7fffffff);
          valid_writable_wakeups = valid_writable_wakeups + 1;
          break;
        }
        goto LAB_00165721;
      case 2:
      case 3:
        lVar9 = *(long *)((long)&handle_01->cloexec_lock + 0x18);
        if (lVar9 == 0x10000) goto LAB_0016571c;
        sVar10 = 0x10000 - lVar9;
        if (0x4d1 < sVar10) {
          sVar10 = 0x4d2;
        }
        uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
        puVar16 = (uv_loop_t *)(ulong)uVar5;
        sVar6 = send(uVar5,connection_poll_cb::buffer_3,sVar10,0);
        uVar5 = (uint)sVar6;
        if (-1 < (int)uVar5) {
          if (uVar5 != 0) {
            valid_writable_wakeups = valid_writable_wakeups + 1;
            uVar7 = *(long *)((long)&handle_01->cloexec_lock + 0x18) + (ulong)(uVar5 & 0x7fffffff);
            *(ulong *)((long)&handle_01->cloexec_lock + 0x18) = uVar7;
            while (uVar7 < 0x10000) {
              sVar10 = 0x10000 - uVar7;
              if (uVar7 < 0xfb2f) {
                sVar10 = 0x4d2;
              }
              uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
              puVar16 = (uv_loop_t *)(ulong)uVar5;
              sVar6 = send(uVar5,connection_poll_cb::buffer_3,sVar10,0);
              if ((int)(uint)sVar6 < 1) {
                piVar8 = __errno_location();
                if ((*piVar8 != 0xb) && (*piVar8 != 0x73)) {
                  connection_poll_cb_cold_8();
                  goto LAB_001656ef;
                }
                break;
              }
              uVar7 = *(long *)((long)&handle_01->cloexec_lock + 0x18) +
                      (ulong)((uint)sVar6 & 0x7fffffff);
              *(ulong *)((long)&handle_01->cloexec_lock + 0x18) = uVar7;
            }
            break;
          }
          goto LAB_00165726;
        }
LAB_0016568b:
        piVar8 = __errno_location();
        if ((*piVar8 == 0xb) || (*piVar8 == 0x73)) goto LAB_001656a0;
        goto LAB_00165730;
      case 4:
        break;
      case 5:
        uVar2 = uVar2 & 0xfffffffd;
        handle = &(handle_01->wq_mutex).__data.__list;
        iVar3 = uv_is_active((uv_handle_t *)handle);
        if (iVar3 == 0) {
          *(undefined4 *)&handle_01->closing_handles = 2;
          uv_timer_start((uv_timer_t *)handle,delay_timer_cb,100,0);
        }
        else {
          *(byte *)&handle_01->closing_handles = *(byte *)&handle_01->closing_handles | 2;
        }
        break;
      case 6:
        uv_poll_start((uv_poll_t *)handle_01,1,connection_poll_cb);
        uv_poll_start((uv_poll_t *)handle_01,2,connection_poll_cb);
        *(undefined4 *)((long)&handle_01->cloexec_lock + 0x34) = 2;
        break;
      default:
        goto switchD_001654f0_default;
      }
switchD_001654f0_caseD_4:
      if ((extraout_EDX & 4) != 0) {
        (handle_01->cloexec_lock).__data.__flags = 1;
        disconnects = disconnects + 1;
        uVar2 = uVar2 & 0xfffffffb;
      }
      if (((*(int *)((long)&handle_01->cloexec_lock + 0x28) == 0) ||
          (*(int *)((long)&handle_01->cloexec_lock + 0x2c) == 0)) ||
         ((handle_01->cloexec_lock).__data.__flags == 0)) {
        if (uVar2 != *(uint *)((long)&handle_01->cloexec_lock + 0x34)) {
          *(uint *)((long)&handle_01->cloexec_lock + 0x34) = uVar2;
          uv_poll_start((uv_poll_t *)puVar15,uVar2,connection_poll_cb);
          uVar2 = *(uint *)((long)&handle_01->cloexec_lock + 0x34);
        }
        if (uVar2 != 0) {
          iVar3 = uv_is_active((uv_handle_t *)puVar15);
          if (iVar3 == 1) {
            return 1;
          }
          connection_poll_cb_cold_16();
        }
      }
      else {
        close_socket((handle_01->cloexec_lock).__data.__wrphase_futex);
        uv_close((uv_handle_t *)handle_01,connection_close_cb);
        uv_close((uv_handle_t *)&(handle_01->wq_mutex).__data.__list,connection_close_cb);
        *(undefined4 *)((long)&handle_01->cloexec_lock + 0x34) = 0;
      }
      iVar3 = uv_is_active((uv_handle_t *)puVar15);
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_001656fe;
    }
    uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
    puVar16 = (uv_loop_t *)(ulong)uVar5;
    iVar3 = shutdown(uVar5,1);
    if (iVar3 == 0) {
      *(undefined4 *)((long)&handle_01->cloexec_lock + 0x2c) = 1;
      uVar2 = uVar2 & 0xfffffffd;
      goto switchD_001654f0_caseD_4;
    }
  }
  else {
LAB_001656ef:
    connection_poll_cb_cold_1();
    puVar15 = puVar16;
LAB_001656f4:
    connection_poll_cb_cold_18();
LAB_001656f9:
    connection_poll_cb_cold_2();
LAB_001656fe:
    connection_poll_cb_cold_17();
    puVar16 = puVar15;
  }
  connection_poll_cb_cold_7();
LAB_00165708:
  connection_poll_cb_cold_5();
LAB_0016570d:
  connection_poll_cb_cold_3();
switchD_00165261_default:
  connection_poll_cb_cold_6();
LAB_00165717:
  connection_poll_cb_cold_14();
LAB_0016571c:
  connection_poll_cb_cold_11();
LAB_00165721:
  connection_poll_cb_cold_12();
LAB_00165726:
  connection_poll_cb_cold_9();
switchD_001654f0_default:
  connection_poll_cb_cold_15();
LAB_00165730:
  connection_poll_cb_cold_10();
  iVar3 = close((int)puVar16);
  if ((iVar3 == 0) || (piVar8 = __errno_location(), *piVar8 == 0x68)) {
    return extraout_EAX_00;
  }
  close_socket_cold_1();
  puVar15 = (uv_loop_t *)puVar16->data;
  iVar3 = uv_is_active((uv_handle_t *)puVar16);
  if (iVar3 == 0) {
    if (*(uint *)&puVar15->closing_handles == 0) goto LAB_00165797;
    uVar2 = *(uint *)&puVar15->closing_handles | *(uint *)((long)&puVar15->cloexec_lock + 0x34);
    *(uint *)((long)&puVar15->cloexec_lock + 0x34) = uVar2;
    *(undefined4 *)&puVar15->closing_handles = 0;
    iVar3 = uv_poll_start((uv_poll_t *)puVar15,uVar2,connection_poll_cb);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_00165797:
    puVar15 = puVar16;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  puVar14 = (undefined8 *)puVar15->data;
  piVar8 = (int *)((long)puVar14 + 0x154);
  *piVar8 = *piVar8 + -1;
  if (*piVar8 != 0) {
    return extraout_EAX_01;
  }
  if (test_mode == '\x01') {
    lVar9 = puVar14[0x28];
    if (*(int *)(puVar14 + 0x2a) != 0) {
      if (lVar9 == 0x10000) {
        if (puVar14[0x29] == 0) goto LAB_00165803;
        connection_close_cb_cold_2();
        goto LAB_001657df;
      }
      goto LAB_001657ec;
    }
LAB_001657f1:
    if (lVar9 != 0) goto LAB_00165814;
  }
  else {
LAB_001657df:
    if (puVar14[0x28] != 0x10000) {
LAB_001657ec:
      connection_close_cb_cold_1();
      lVar9 = extraout_RAX;
      goto LAB_001657f1;
    }
  }
  if (puVar14[0x29] == 0x10000) {
LAB_00165803:
    closed_connections = closed_connections + 1;
    free(puVar14);
    return extraout_EAX_02;
  }
  connection_close_cb_cold_4();
LAB_00165814:
  connection_close_cb_cold_3();
  free((void *)*puVar14);
  return extraout_EAX_03;
}

Assistant:

static uv_os_sock_t create_bound_socket (struct sockaddr_in bind_addr) {
  uv_os_sock_t sock;
  int r;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT(sock != INVALID_SOCKET);
#else
  ASSERT(sock >= 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT(r == 0);
  }
#endif

  r = bind(sock, (const struct sockaddr*) &bind_addr, sizeof bind_addr);
  ASSERT(r == 0);

  return sock;
}